

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::SerializeLedgerFormat
          (JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::SerializeLedgerFormatResponseStruct_(const_cfd::js::api::SerializeLedgerFormatRequestStruct_&)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::
  function<cfd::js::api::SerializeLedgerFormatResponseStruct(cfd::js::api::SerializeLedgerFormatRequestStruct_const&)>
  ::
  function<cfd::js::api::SerializeLedgerFormatResponseStruct(&)(cfd::js::api::SerializeLedgerFormatRequestStruct_const&),void>
            ((function<cfd::js::api::SerializeLedgerFormatResponseStruct(cfd::js::api::SerializeLedgerFormatRequestStruct_const&)>
              *)&local_38,ElementsTransactionStructApi::SerializeLedgerFormat);
  ExecuteJsonApi<cfd::js::api::json::SerializeLedgerFormatRequest,cfd::js::api::json::SerializeLedgerFormatResponse,cfd::js::api::SerializeLedgerFormatRequestStruct,cfd::js::api::SerializeLedgerFormatResponseStruct>
            ((json *)this,request_message,&local_38);
  std::
  function<cfd::js::api::SerializeLedgerFormatResponseStruct_(const_cfd::js::api::SerializeLedgerFormatRequestStruct_&)>
  ::~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::SerializeLedgerFormat(
    const std::string &request_message) {
  return ExecuteJsonApi<
      api::json::SerializeLedgerFormatRequest,
      api::json::SerializeLedgerFormatResponse,
      api::SerializeLedgerFormatRequestStruct,
      api::SerializeLedgerFormatResponseStruct>(
      request_message, ElementsTransactionStructApi::SerializeLedgerFormat);
}